

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O3

bsc_step_t
bsc_allreduce_2tree_multiple
          (bsc_step_t depends,bsc_pid_t root,bsc_group_t group,bsc_coll_params_t *params,
          bsc_size_t n)

{
  bsc_step_t bVar1;
  long lVar2;
  
  bVar1 = depends;
  if (0 < n) {
    lVar2 = 0;
    do {
      bVar1 = bsc_allreduce_qtree_single
                        (depends,group,*(void **)((long)&params->src + lVar2),
                         *(void **)((long)&params->dst + lVar2),
                         *(void **)((long)&params->tmp + lVar2),
                         *(bsc_reduce_t *)((long)&params->reducer + lVar2),
                         *(void **)((long)&params->zero + lVar2),
                         *(bsc_size_t *)((long)&params->nmemb + lVar2),
                         *(bsc_size_t *)((long)&params->size + lVar2),2);
      lVar2 = lVar2 + 0x30;
    } while ((ulong)(uint)n * 0x30 != lVar2);
  }
  return bVar1;
}

Assistant:

bsc_step_t bsc_allreduce_2tree_multiple( bsc_step_t depends,
                      bsc_pid_t root, bsc_group_t group, 
                      bsc_coll_params_t * params, bsc_size_t n)
{
    bsc_size_t i;
    bsc_step_t finished = depends;
    (void) root;
    for ( i = 0; i < n ; ++i ) {
        finished = bsc_allreduce_qtree_single( depends, group,
                   params[i].src, params[i].dst, params[i].tmp,
                   params[i].reducer, params[i].zero, 
                   params[i].nmemb, params[i].size, 2 );
    }

    return finished;
}